

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ConcurrentAssertionStatementSyntax::setChild
          (ConcurrentAssertionStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0022ed40 + *(int *)(&DAT_0022ed40 + index * 4)))();
  return;
}

Assistant:

void ConcurrentAssertionStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: keyword = child.token(); return;
        case 3: propertyOrSequence = child.token(); return;
        case 4: openParen = child.token(); return;
        case 5: propertySpec = child.node() ? &child.node()->as<PropertySpecSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        case 7: action = child.node() ? &child.node()->as<ActionBlockSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}